

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O3

bool dxil_spv::dxil_instruction_has_side_effects(CallInst *instruction)

{
  bool bVar1;
  TypeID TVar2;
  undefined8 in_RAX;
  Type *this;
  bool bVar3;
  uint32_t opcode;
  uint32_t local_14;
  
  local_14 = (uint32_t)((ulong)in_RAX >> 0x20);
  bVar3 = false;
  bVar1 = get_constant_operand(&instruction->super_Instruction,0,&local_14);
  if (bVar1) {
    this = LLVMBC::Value::getType((Value *)instruction);
    TVar2 = LLVMBC::Type::getTypeID(this);
    bVar3 = true;
    if (TVar2 != VoidTyID) {
      if ((int)local_14 < 0x8c) {
        if ((local_14 - 0x43 < 0x28) &&
           ((0x81c000b80dU >> ((ulong)(local_14 - 0x43) & 0x3f) & 1) != 0)) {
          return true;
        }
        if (local_14 == 5) {
          return true;
        }
      }
      else {
        if ((local_14 - 0x8c < 0x2c) &&
           ((0xfbfb00f8001U >> ((ulong)(local_14 - 0x8c) & 0x3f) & 1) != 0)) {
          return true;
        }
        if (local_14 == 0xe1) {
          return true;
        }
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool dxil_instruction_has_side_effects(const llvm::CallInst *instruction)
{
	uint32_t opcode;
	if (!get_constant_operand(instruction, 0, &opcode))
		return false;

	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::VoidTyID)
		return true;

	bool ret;

	// Most of these are covered by the void check, but be exhaustive for completeness.
	switch (DXIL::Op(opcode))
	{
	case DXIL::Op::StoreOutput:
	case DXIL::Op::TextureStore:
	case DXIL::Op::BufferStore:
	case DXIL::Op::BufferUpdateCounter:
	case DXIL::Op::AtomicBinOp:
	case DXIL::Op::AtomicCompareExchange:
	case DXIL::Op::Barrier:
	case DXIL::Op::Discard:
	case DXIL::Op::EmitStream:
	case DXIL::Op::CutStream:
	case DXIL::Op::EmitThenCutStream:
	case DXIL::Op::StorePatchConstant:
	case DXIL::Op::RawBufferStore:
	case DXIL::Op::IgnoreHit:
	case DXIL::Op::AcceptHitAndEndSearch:
	case DXIL::Op::TraceRay:
	case DXIL::Op::ReportHit:
	case DXIL::Op::CallShader:
	case DXIL::Op::SetMeshOutputCounts:
	case DXIL::Op::EmitIndices:
	case DXIL::Op::StoreVertexOutput:
	case DXIL::Op::StorePrimitiveOutput:
	case DXIL::Op::DispatchMesh:
	case DXIL::Op::WriteSamplerFeedback:
	case DXIL::Op::WriteSamplerFeedbackBias:
	case DXIL::Op::WriteSamplerFeedbackLevel:
	case DXIL::Op::WriteSamplerFeedbackGrad:
	case DXIL::Op::RayQuery_TraceRayInline:
	case DXIL::Op::RayQuery_Proceed:
	case DXIL::Op::RayQuery_Abort:
	case DXIL::Op::RayQuery_CommitNonOpaqueTriangleHit:
	case DXIL::Op::RayQuery_CommitProceduralPrimitiveHit:
	case DXIL::Op::TextureStoreSample:
		ret = true;
		break;

	default:
		ret = false;
		break;
	}

	return ret;
}